

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPointer<QMdiSubWindow>_>::copyAppend
          (QGenericArrayOps<QPointer<QMdiSubWindow>_> *this,QPointer<QMdiSubWindow> *b,
          QPointer<QMdiSubWindow> *e)

{
  QPointer<QMdiSubWindow> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QPointer<QMdiSubWindow> *in_RDI;
  QPointer<QMdiSubWindow> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QPointer<QMdiSubWindow>_>::begin
                        ((QArrayDataPointer<QPointer<QMdiSubWindow>_> *)0x622117);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPointer<QMdiSubWindow>::QPointer(this_00,in_RDI);
      local_10 = local_10 + 0x10;
      in_RDI[1].wp.d = in_RDI[1].wp.d + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }